

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

void __thiscall ThreadParser::domCheckSum(ThreadParser *this,DOMNode *node)

{
  undefined4 uVar1;
  XMLCh *pXVar2;
  long *plVar3;
  long lVar4;
  DOMNode *node_00;
  long lVar5;
  
  uVar1 = (**(code **)(*(long *)node + 0x20))(node);
  switch(uVar1) {
  case 1:
    pXVar2 = (XMLCh *)(**(code **)(*(long *)node + 0x10))(node);
    plVar3 = (long *)(**(code **)(*(long *)node + 0x58))(node);
    lVar4 = (**(code **)(*plVar3 + 0x28))(plVar3);
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      node_00 = (DOMNode *)(**(code **)(*plVar3 + 0x18))(plVar3,lVar5);
      domCheckSum(this,node_00);
    }
    addToCheckSum(this,pXVar2,0xffffffffffffffff);
    lVar4 = 0x38;
    while (node = (DOMNode *)(**(code **)(*(long *)node + lVar4))(node), node != (DOMNode *)0x0) {
      domCheckSum(this,node);
      lVar4 = 0x50;
    }
    break;
  case 2:
    pXVar2 = (XMLCh *)(**(code **)(*(long *)node + 0x10))(node);
    addToCheckSum(this,pXVar2,0xffffffffffffffff);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)node + 0x18))(node);
    if (pXVar2 != (XMLCh *)0x0) goto LAB_00104dff;
    break;
  case 3:
  case 4:
    pXVar2 = (XMLCh *)(**(code **)(*(long *)node + 0x18))(node);
LAB_00104dff:
    addToCheckSum(this,pXVar2,0xffffffffffffffff);
    return;
  case 5:
  case 9:
    lVar4 = 0x38;
    while (node = (DOMNode *)(**(code **)(*(long *)node + lVar4))(node), node != (DOMNode *)0x0) {
      domCheckSum(this,node);
      lVar4 = 0x50;
    }
  }
  return;
}

Assistant:

void ThreadParser::domCheckSum(const DOMNode *node)
{
    const XMLCh        *s;
    DOMNode          *child;
    DOMNamedNodeMap  *attributes;

    switch (node->getNodeType() )
    {
    case DOMNode::ELEMENT_NODE:
        {
            s = node->getNodeName();   // the element name

            attributes = node->getAttributes();  // Element's attributes
            XMLSize_t numAttributes = attributes->getLength();
            XMLSize_t i;
            for (i=0; i<numAttributes; i++)
                domCheckSum(attributes->item(i));

            addToCheckSum(s);          // Content and Children
            for (child=node->getFirstChild(); child!=0; child=child->getNextSibling())
                domCheckSum(child);

            break;
        }

    case DOMNode::ATTRIBUTE_NODE:
        {
            s = node->getNodeName();  // The attribute name
            addToCheckSum(s);
            s = node->getNodeValue();  // The attribute value
            if (s != 0)
                addToCheckSum(s);
            break;
        }

    case DOMNode::TEXT_NODE:
    case DOMNode::CDATA_SECTION_NODE:
        {
            s = node->getNodeValue();
            addToCheckSum(s);
            break;
        }

    case DOMNode::ENTITY_REFERENCE_NODE:
    case DOMNode::DOCUMENT_NODE:
        {
            // For entity references and the document, nothing is dirctly
            //  added to the checksum, but we do want to process the chidren nodes.
            //
            for (child=node->getFirstChild(); child!=0; child=child->getNextSibling())
                domCheckSum(child);
            break;
        }
    case DOMNode::ENTITY_NODE:
    case DOMNode::PROCESSING_INSTRUCTION_NODE:
    case DOMNode::COMMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::NOTATION_NODE:
        break;
    }
}